

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::Utils::Variable::Descriptor::GetDefinition_abi_cxx11_
          (string *__return_storage_ptr__,Descriptor *this,FLAVOUR flavour,STORAGE storage)

{
  byte bVar1;
  TestError *pTVar2;
  GLchar *pGVar3;
  reference pvVar4;
  char local_88 [8];
  char buffer [16];
  string local_70;
  string *local_50;
  string *block_definition;
  bool flat_qualifier;
  size_t local_38;
  size_t position;
  char *local_28;
  GLchar *storage_str;
  STORAGE storage_local;
  FLAVOUR flavour_local;
  Descriptor *this_local;
  string *definition;
  
  local_28 = (char *)0x0;
  position._7_1_ = 0;
  storage_str._0_4_ = storage;
  storage_str._4_4_ = flavour;
  _storage_local = this;
  this_local = (Descriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38 = 0;
  if (storage_str._4_4_ == BASIC) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,GetDefinition::basic_template);
  }
  else {
    if (1 < storage_str._4_4_ - ARRAY) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0xf9b);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,GetDefinition::array_template);
  }
  if ((this->m_type != BUILTIN) && ((this->field_9).m_interface == (Interface *)0x0)) {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Nullptr",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xfa3);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    replaceToken("QUALIFIERS ",&local_38,"",__return_storage_ptr__);
  }
  else {
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    replaceToken("QUALIFIERS",&local_38,pGVar3,__return_storage_ptr__);
  }
  block_definition._3_1_ = 0;
  if (((this->m_type != BUILTIN) && ((this->field_9).m_interface != (Interface *)0x0)) &&
     ((pvVar4 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ::operator[](&((this->field_9).m_interface)->m_members,0),
      (pvVar4->field_9).m_builtin.m_basic_type == Int ||
      (pvVar4 = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                ::operator[](&((this->field_9).m_interface)->m_members,0),
      (pvVar4->field_9).m_builtin.m_basic_type == Uint)))) {
    block_definition._3_1_ = 1;
  }
  switch((STORAGE)storage_str) {
  case VARYING_INPUT:
    local_28 = "in ";
    if ((block_definition._3_1_ & 1) != 0) {
      local_28 = "flat in ";
    }
    break;
  case VARYING_OUTPUT:
    local_28 = "out ";
    break;
  case UNIFORM:
    local_28 = "uniform ";
    break;
  case SSB:
    local_28 = "buffer ";
    break;
  case MEMBER:
    local_28 = "";
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xfce);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  replaceToken("STORAGE",&local_38,local_28,__return_storage_ptr__);
  if (this->m_type == BUILTIN) {
    pGVar3 = Utils::Type::GetGLSLTypeName(&(this->field_9).m_builtin);
    replaceToken("TYPE",&local_38,pGVar3,__return_storage_ptr__);
  }
  else if (((this->field_9).m_interface)->m_type == STRUCT) {
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    replaceToken("TYPE",&local_38,pGVar3,__return_storage_ptr__);
  }
  else {
    Interface::GetDefinition_abi_cxx11_(&local_70,(this->field_9).m_interface);
    local_50 = &local_70;
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    replaceToken("TYPE",&local_38,pGVar3,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("NAME",&local_38,pGVar3,__return_storage_ptr__);
  if (this->m_n_array_elements == 0) {
    replaceToken("ARRAY",&local_38,"",__return_storage_ptr__);
  }
  else {
    sprintf(local_88,"[%d]",(ulong)this->m_n_array_elements);
    replaceToken("ARRAY",&local_38,local_88,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::Descriptor::GetDefinition(FLAVOUR flavour, STORAGE storage) const
{
	static const GLchar* basic_template = "QUALIFIERS STORAGETYPE NAMEARRAY;";
	static const GLchar* array_template = "QUALIFIERS STORAGETYPE NAME[]ARRAY;";
	const GLchar*		 storage_str	= 0;

	std::string definition;
	size_t		position = 0;

	/* Select definition template */
	switch (flavour)
	{
	case BASIC:
		definition = basic_template;
		break;
	case ARRAY:
	case INDEXED_BY_INVOCATION_ID:
		definition = array_template;
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}

	if (BUILTIN != m_type)
	{
		if (0 == m_interface)
		{
			TCU_FAIL("Nullptr");
		}
	}

	/* Qualifiers */
	if (true == m_qualifiers.empty())
	{
		replaceToken("QUALIFIERS ", position, "", definition);
	}
	else
	{
		replaceToken("QUALIFIERS", position, m_qualifiers.c_str(), definition);
	}

	// According to spec: integer or unsigned integer type must always be declared with flat qualifier
	bool flat_qualifier = false;
	if (m_type != BUILTIN && m_interface != NULL)
	{
		if (m_interface->m_members[0].m_builtin.m_basic_type == Utils::Type::Int ||
			m_interface->m_members[0].m_builtin.m_basic_type == Utils::Type::Uint)
		{
			flat_qualifier = true;
		}
	}
	/* Storage */
	switch (storage)
	{
	case VARYING_INPUT:
		storage_str = flat_qualifier ? "flat in " : "in ";
		break;
	case VARYING_OUTPUT:
		storage_str = "out ";
		break;
	case UNIFORM:
		storage_str = "uniform ";
		break;
	case SSB:
		storage_str = "buffer ";
		break;
	case MEMBER:
		storage_str = "";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	replaceToken("STORAGE", position, storage_str, definition);

	/* Type */
	if (BUILTIN == m_type)
	{
		replaceToken("TYPE", position, m_builtin.GetGLSLTypeName(), definition);
	}
	else
	{
		if (Interface::STRUCT == m_interface->m_type)
		{
			replaceToken("TYPE", position, m_interface->m_name.c_str(), definition);
		}
		else
		{
			const std::string& block_definition = m_interface->GetDefinition();

			replaceToken("TYPE", position, block_definition.c_str(), definition);
		}
	}

	/* Name */
	replaceToken("NAME", position, m_name.c_str(), definition);

	/* Array size */
	if (0 == m_n_array_elements)
	{
		replaceToken("ARRAY", position, "", definition);
	}
	else
	{
		char buffer[16];
		sprintf(buffer, "[%d]", m_n_array_elements);

		replaceToken("ARRAY", position, buffer, definition);
	}

	/* Done */
	return definition;
}